

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O1

CURLcode baller_connected(Curl_cfilter *cf,Curl_easy *data,cf_hc_baller *winner)

{
  uchar uVar1;
  undefined4 *puVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  CURLcode CVar5;
  char *pcVar6;
  curltime older;
  curltime newer;
  curltime cVar7;
  
  puVar2 = (undefined4 *)cf->ctx;
  if ((cf_hc_baller *)(puVar2 + 10) != winner) {
    cf_hc_baller_reset((cf_hc_baller *)(puVar2 + 10),data);
  }
  if ((cf_hc_baller *)(puVar2 + 0x16) != winner) {
    cf_hc_baller_reset((cf_hc_baller *)(puVar2 + 0x16),data);
  }
  if ((((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
      ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < cf->cft->log_level)) {
    pcVar6 = winner->name;
    cVar7 = Curl_now();
    uVar3 = (winner->started).tv_sec;
    uVar4 = (winner->started).tv_usec;
    older.tv_usec = uVar4;
    older.tv_sec = uVar3;
    older._12_4_ = 0;
    newer._12_4_ = 0;
    newer.tv_sec = SUB128(cVar7._0_12_,0);
    newer.tv_usec = SUB124(cVar7._0_12_,8);
    Curl_timediff(newer,older);
    if (winner->reply_ms < 0) {
      (*winner->cf->cft->query)(winner->cf,data,2,&winner->reply_ms,(void *)0x0);
    }
    Curl_trc_cf_infof(data,cf,"connect+handshake %s: %dms, 1st data: %dms",pcVar6);
  }
  cf->next = winner->cf;
  winner->cf = (Curl_cfilter *)0x0;
  uVar1 = cf->conn->alpn;
  if (uVar1 == '\x03') {
    CVar5 = Curl_http2_switch_at(cf,data);
    if (CVar5 != CURLE_OK) {
      *puVar2 = 3;
      puVar2[8] = CVar5;
      return CVar5;
    }
    if ((data == (Curl_easy *)0x0) || (((data->set).field_0x8bd & 0x10) == 0)) goto LAB_005fbff3;
    pcVar6 = "using HTTP/2";
  }
  else if (uVar1 == '\x1e') {
    if ((data == (Curl_easy *)0x0) || (((data->set).field_0x8bd & 0x10) == 0)) goto LAB_005fbff3;
    pcVar6 = "using HTTP/3";
  }
  else {
    if ((data == (Curl_easy *)0x0) || (((data->set).field_0x8bd & 0x10) == 0)) goto LAB_005fbff3;
    pcVar6 = "using HTTP/1.x";
  }
  Curl_infof(data,pcVar6);
LAB_005fbff3:
  *puVar2 = 2;
  cf->field_0x24 = cf->field_0x24 | 1;
  Curl_conn_cf_cntrl(cf->next,data,true,0x100,0,(void *)0x0);
  return CURLE_OK;
}

Assistant:

static CURLcode baller_connected(struct Curl_cfilter *cf,
                                 struct Curl_easy *data,
                                 struct cf_hc_baller *winner)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(winner->cf);
  if(winner != &ctx->h3_baller)
    cf_hc_baller_reset(&ctx->h3_baller, data);
  if(winner != &ctx->h21_baller)
    cf_hc_baller_reset(&ctx->h21_baller, data);

  CURL_TRC_CF(data, cf, "connect+handshake %s: %dms, 1st data: %dms",
              winner->name, (int)Curl_timediff(Curl_now(), winner->started),
              cf_hc_baller_reply_ms(winner, data));
  cf->next = winner->cf;
  winner->cf = NULL;

  switch(cf->conn->alpn) {
  case CURL_HTTP_VERSION_3:
    infof(data, "using HTTP/3");
    break;
  case CURL_HTTP_VERSION_2:
#ifdef USE_NGHTTP2
    /* Using nghttp2, we add the filter "below" us, so when the conn
     * closes, we tear it down for a fresh reconnect */
    result = Curl_http2_switch_at(cf, data);
    if(result) {
      ctx->state = CF_HC_FAILURE;
      ctx->result = result;
      return result;
    }
#endif
    infof(data, "using HTTP/2");
    break;
  default:
    infof(data, "using HTTP/1.x");
    break;
  }
  ctx->state = CF_HC_SUCCESS;
  cf->connected = TRUE;
  Curl_conn_cf_cntrl(cf->next, data, TRUE,
                     CF_CTRL_CONN_INFO_UPDATE, 0, NULL);
  return result;
}